

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O0

void __thiscall
trial::protocol::json::example::pretty_printer::indent(pretty_printer *this,int level)

{
  int iVar1;
  basic_writer<char,_16UL> *this_00;
  allocator<char> local_49;
  string local_48 [32];
  view_type local_28;
  int local_14;
  pretty_printer *ppStack_10;
  int level_local;
  pretty_printer *this_local;
  
  this_00 = this->writer;
  iVar1 = this->indent_width;
  local_14 = level;
  ppStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,(long)(iVar1 * level),' ',&local_49);
  local_28 = (view_type)std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  basic_writer<char,_16UL>::literal(this_00,&local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void indent(int level)
    {
        writer.literal(std::string(indent_width * level, ' '));
    }